

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ClientSession::on_keep_alive(ClientSession *this)

{
  undefined8 uVar1;
  parse_error *e;
  undefined1 local_30 [24];
  ServerKeepAlive keep_alive;
  ClientSession *this_local;
  
  keep_alive._8_8_ = this;
  control::ServerKeepAlive::ServerKeepAlive((ServerKeepAlive *)(local_30 + 0x10),0);
  Session::read_data<ki::protocol::control::ServerKeepAlive>((Session *)local_30);
  control::ServerKeepAlive::operator=
            ((ServerKeepAlive *)(local_30 + 0x10),(ServerKeepAlive *)local_30);
  control::ServerKeepAlive::~ServerKeepAlive((ServerKeepAlive *)local_30);
  uVar1 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(&this->field_0x28 + (long)this->_vptr_ClientSession[-3]) = uVar1;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),
             true,'\x04',(Serializable *)(local_30 + 0x10));
  control::ServerKeepAlive::~ServerKeepAlive((ServerKeepAlive *)(local_30 + 0x10));
  return;
}

Assistant:

void ClientSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ServerKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ServerKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}